

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  long lVar1;
  long lVar2;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    if (MRIC->c != (realtype *)0x0) {
      free(MRIC->c);
    }
    if (MRIC->W != (realtype ***)0x0) {
      if (0 < MRIC->nmat) {
        lVar1 = 0;
        do {
          if (MRIC->W[lVar1] != (realtype **)0x0) {
            if (0 < MRIC->stages) {
              lVar2 = 0;
              do {
                if (MRIC->W[lVar1][lVar2] != (realtype *)0x0) {
                  free(MRIC->W[lVar1][lVar2]);
                  MRIC->W[lVar1][lVar2] = (realtype *)0x0;
                }
                lVar2 = lVar2 + 1;
              } while (lVar2 < MRIC->stages);
            }
            free(MRIC->W[lVar1]);
            MRIC->W[lVar1] = (realtype **)0x0;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < MRIC->nmat);
      }
      free(MRIC->W);
    }
    if (MRIC->G != (realtype ***)0x0) {
      if (0 < MRIC->nmat) {
        lVar1 = 0;
        do {
          if (MRIC->G[lVar1] != (realtype **)0x0) {
            if (0 < MRIC->stages) {
              lVar2 = 0;
              do {
                if (MRIC->G[lVar1][lVar2] != (realtype *)0x0) {
                  free(MRIC->G[lVar1][lVar2]);
                  MRIC->G[lVar1][lVar2] = (realtype *)0x0;
                }
                lVar2 = lVar2 + 1;
              } while (lVar2 < MRIC->stages);
            }
            free(MRIC->G[lVar1]);
            MRIC->G[lVar1] = (realtype **)0x0;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < MRIC->nmat);
      }
      free(MRIC->G);
    }
    free(MRIC);
    return;
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC) {

    if (MRIC->c)
      free(MRIC->c);

    if (MRIC->W) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->W[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->W[k][i]) {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      free(MRIC->W);
    }

    if (MRIC->G) {
      for (k=0; k<MRIC->nmat; k++)
        if (MRIC->G[k]) {
          for (i=0; i<MRIC->stages; i++)
            if (MRIC->G[k][i]) {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      free(MRIC->G);
    }

    free(MRIC);
  }
}